

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O0

void Omega_h::gmsh::anon_unknown_0::seek_line(istream *stream,string *want)

{
  bool bVar1;
  __type _Var2;
  istream *piVar3;
  string local_38 [8];
  string line;
  string *want_local;
  istream *stream_local;
  
  bVar1 = std::ios::operator_cast_to_bool(stream + *(long *)(*(long *)stream + -0x18));
  if (!bVar1) {
    fail("assertion %s failed at %s +%d\n","stream",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,0x62);
  }
  std::__cxx11::string::string(local_38);
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(stream,local_38);
    bVar1 = std::ios::operator_cast_to_bool(piVar3 + *(long *)(*(long *)piVar3 + -0x18));
    if (!bVar1) break;
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,want);
  } while (!_Var2);
  bVar1 = std::ios::operator_cast_to_bool(stream + *(long *)(*(long *)stream + -0x18));
  if (bVar1) {
    std::__cxx11::string::~string(local_38);
    return;
  }
  fail("assertion %s failed at %s +%d\n","stream",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
       ,0x69);
}

Assistant:

void seek_line(std::istream& stream, std::string const& want) {
  OMEGA_H_CHECK(stream);
  std::string line;
  while (std::getline(stream, line)) {
    if (line == want) {
      break;
    }
  }
  OMEGA_H_CHECK(stream);
}